

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hebrwcal.cpp
# Opt level: O0

int32_t icu_63::HebrewCalendar::startOfYear(int32_t year,UErrorCode *status)

{
  UBool UVar1;
  int iVar2;
  long lVar3;
  int local_2c;
  int32_t wd;
  int64_t frac;
  int32_t months;
  int32_t day;
  UErrorCode *status_local;
  int32_t year_local;
  
  ucln_i18n_registerCleanup_63(UCLN_I18N_HEBREW_CALENDAR,calendar_hebrew_cleanup);
  frac._4_4_ = CalendarCache::get(&gCache,year,status);
  if (frac._4_4_ == 0) {
    iVar2 = (year * 0xeb + -0xea) / 0x13;
    lVar3 = (long)iVar2 * 0x35b9 + 0x2f34;
    frac._4_4_ = iVar2 * 0x1d + (int)(lVar3 / 0x6540);
    lVar3 = lVar3 % 0x6540;
    local_2c = frac._4_4_ % 7;
    if (((local_2c == 2) || (local_2c == 4)) || (local_2c == 6)) {
      frac._4_4_ = frac._4_4_ + 1;
      local_2c = frac._4_4_ % 7;
    }
    if (((local_2c == 1) && (0x4014 < lVar3)) && (UVar1 = isLeapYear(year), UVar1 == '\0')) {
      frac._4_4_ = frac._4_4_ + 2;
    }
    else if (((local_2c == 0) && (0x5ae5 < lVar3)) && (UVar1 = isLeapYear(year + -1), UVar1 != '\0')
            ) {
      frac._4_4_ = frac._4_4_ + 1;
    }
    CalendarCache::put(&gCache,year,frac._4_4_,status);
  }
  return frac._4_4_;
}

Assistant:

int32_t HebrewCalendar::startOfYear(int32_t year, UErrorCode &status)
{
    ucln_i18n_registerCleanup(UCLN_I18N_HEBREW_CALENDAR, calendar_hebrew_cleanup);
    int32_t day = CalendarCache::get(&gCache, year, status);

    if (day == 0) {
        int32_t months = (235 * year - 234) / 19;           // # of months before year

        int64_t frac = (int64_t)months * MONTH_FRACT + BAHARAD;  // Fractional part of day #
        day  = months * 29 + (int32_t)(frac / DAY_PARTS);        // Whole # part of calculation
        frac = frac % DAY_PARTS;                        // Time of day

        int32_t wd = (day % 7);                        // Day of week (0 == Monday)

        if (wd == 2 || wd == 4 || wd == 6) {
            // If the 1st is on Sun, Wed, or Fri, postpone to the next day
            day += 1;
            wd = (day % 7);
        }
        if (wd == 1 && frac > 15*HOUR_PARTS+204 && !isLeapYear(year) ) {
            // If the new moon falls after 3:11:20am (15h204p from the previous noon)
            // on a Tuesday and it is not a leap year, postpone by 2 days.
            // This prevents 356-day years.
            day += 2;
        }
        else if (wd == 0 && frac > 21*HOUR_PARTS+589 && isLeapYear(year-1) ) {
            // If the new moon falls after 9:32:43 1/3am (21h589p from yesterday noon)
            // on a Monday and *last* year was a leap year, postpone by 1 day.
            // Prevents 382-day years.
            day += 1;
        }
        CalendarCache::put(&gCache, year, day, status);
    }
    return day;
}